

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O3

Vec_Ptr_t * Aig_ManDfs(Aig_Man_t *p,int fNodesOnly)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  long lVar7;
  Aig_Obj_t *pAVar8;
  long lVar9;
  
  Aig_ManIncrementTravId(p);
  pAVar8 = p->pConst1;
  iVar1 = p->nTravIds;
  pAVar8->TravId = iVar1;
  iVar2 = p->vObjs->nSize;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar6;
  if (iVar6 == 0) {
    vNodes->pArray = (void **)0x0;
    if (fNodesOnly != 0) goto LAB_006be539;
    ppvVar4 = (void **)malloc(0x80);
    vNodes->pArray = ppvVar4;
    vNodes->nCap = 0x10;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
    vNodes->pArray = ppvVar4;
    if (fNodesOnly != 0) {
LAB_006be539:
      lVar9 = (long)p->vCis->nSize;
      if (0 < lVar9) {
        ppvVar4 = p->vCis->pArray;
        lVar7 = 0;
        do {
          *(int *)((long)ppvVar4[lVar7] + 0x20) = iVar1;
          lVar7 = lVar7 + 1;
        } while (lVar9 != lVar7);
      }
      bVar3 = false;
      goto LAB_006be583;
    }
  }
  vNodes->nSize = 1;
  *ppvVar4 = pAVar8;
  bVar3 = true;
LAB_006be583:
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pAVar8 = (Aig_Obj_t *)pVVar5->pArray[lVar9];
      if (!bVar3) {
        pAVar8 = (Aig_Obj_t *)((ulong)pAVar8->pFanin0 & 0xfffffffffffffffe);
      }
      Aig_ManDfs_rec(p,pAVar8,vNodes);
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCos;
    } while (lVar9 < pVVar5->nSize);
  }
  if (bVar3) {
    if (vNodes->nSize != p->vObjs->nSize - p->nDeleted) {
      __assert_fail("Vec_PtrSize(vNodes) == Aig_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                    ,0xa6,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
    }
  }
  else if (vNodes->nSize != p->nObjs[6] + p->nObjs[5]) {
    __assert_fail("Vec_PtrSize(vNodes) == Aig_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                  ,0xa4,"Vec_Ptr_t *Aig_ManDfs(Aig_Man_t *, int)");
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Aig_ManDfs( Aig_Man_t * p, int fNodesOnly )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( Aig_ManObjNumMax(p) );
    // mark PIs if they should not be collected
    if ( fNodesOnly )
        Aig_ManForEachCi( p, pObj, i )
            Aig_ObjSetTravIdCurrent( p, pObj );
    else
        Vec_PtrPush( vNodes, Aig_ManConst1(p) );
    // collect nodes reachable in the DFS order
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfs_rec( p, fNodesOnly? Aig_ObjFanin0(pObj): pObj, vNodes );
    if ( fNodesOnly )
        assert( Vec_PtrSize(vNodes) == Aig_ManNodeNum(p) );
    else
        assert( Vec_PtrSize(vNodes) == Aig_ManObjNum(p) );
    return vNodes;
}